

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

int cmp_key_option_proxy_long(void *key,void *item)

{
  size_t sVar1;
  size_t local_60;
  int ret;
  size_t optionLen;
  option_proxy *op;
  char_array *longName;
  void *item_local;
  void *key_local;
  
  if (key == (void *)0x0) {
    __assert_fail("longName != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0xb7,"int cmp_key_option_proxy_long(const void *, const void *)");
  }
  if (item == (void *)0x0) {
    __assert_fail("op != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0xb8,"int cmp_key_option_proxy_long(const void *, const void *)");
  }
  if (*item == 0) {
    __assert_fail("op->option != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0xb9,"int cmp_key_option_proxy_long(const void *, const void *)");
  }
  if (*(long *)((long)item + 8) == 0) {
    __assert_fail("op->context != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0xba,"int cmp_key_option_proxy_long(const void *, const void *)");
  }
  if (*(long *)(*(long *)((long)item + 8) + 0x58) == 0) {
    __assert_fail("op->context->ncmpstr != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                  ,0xbb,"int cmp_key_option_proxy_long(const void *, const void *)");
  }
  if (*key == *(long *)(*item + 8)) {
    key_local._4_4_ = 0;
  }
  else if (*key == 0) {
    key_local._4_4_ = -1;
  }
  else if (*(long *)(*item + 8) == 0) {
    key_local._4_4_ = 1;
  }
  else {
    sVar1 = strlen(*(char **)(*item + 8));
    local_60 = sVar1;
    if (*(ulong *)((long)key + 8) < sVar1) {
      local_60 = *(size_t *)((long)key + 8);
    }
    key_local._4_4_ =
         (**(code **)(*(long *)((long)item + 8) + 0x58))(*key,*(undefined8 *)(*item + 8),local_60);
    if (key_local._4_4_ == 0) {
      if (*(ulong *)((long)key + 8) < sVar1) {
        key_local._4_4_ = -1;
      }
      else if (sVar1 < *(ulong *)((long)key + 8)) {
        key_local._4_4_ = 1;
      }
      else {
        key_local._4_4_ = 0;
      }
    }
  }
  return key_local._4_4_;
}

Assistant:

static int
cmp_key_option_proxy_long(const void* key, const void* item)
{
    const char_array* longName = key;
    const option_proxy* op = item;

    size_t optionLen;
    int ret;

    assert(longName != NULL);
    assert(op != NULL);
    assert(op->option != NULL);
    assert(op->context != NULL);
    assert(op->context->ncmpstr != NULL);

    if (longName->s == op->option->long_name)
    {
        return 0;
    }
    else if (longName->s == NULL)
    {
        return -1;
    }
    else if (op->option->long_name == NULL)
    {
        return +1;
    }

    /* Although the `longName` key might not be `NUL`-terminated, the
     * `option_proxy` item we're searching against must be.
     */
    optionLen = dropt_strlen(op->option->long_name);
    ret = op->context->ncmpstr(longName->s,
                               op->option->long_name,
                               MIN(longName->len, optionLen));
    if (ret != 0)
    {
        return ret;
    }

    if (longName->len < optionLen)
    {
        return -1;
    }
    else if (longName->len > optionLen)
    {
        return +1;
    }

    return 0;
}